

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString BracketsFormattedHexStringFrom(uint value)

{
  size_t extraout_RDX;
  ulong in_RSI;
  undefined4 in_register_0000003c;
  SimpleString SVar1;
  SimpleString local_20;
  
  StringFromFormat((char *)&local_20,"%x",in_RSI & 0xffffffff);
  BracketsFormattedHexString((SimpleString *)CONCAT44(in_register_0000003c,value));
  SimpleString::deallocateInternalBuffer(&local_20);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)CONCAT44(in_register_0000003c,value);
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(unsigned int value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}